

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

MIR_reg_t get_stack_loc(gen_ctx_t gen_ctx,MIR_reg_t start_loc,MIR_type_t type,bitmap_t conflict_locs
                       ,int *slots_num_ref)

{
  MIR_reg_t MVar1;
  int iVar2;
  uint local_3c;
  int local_38;
  int slots_num;
  int k;
  MIR_reg_t best_loc;
  MIR_reg_t curr_loc;
  MIR_reg_t loc;
  int *slots_num_ref_local;
  bitmap_t conflict_locs_local;
  MIR_type_t type_local;
  MIR_reg_t start_loc_local;
  gen_ctx_t gen_ctx_local;
  
  slots_num = -1;
  local_3c = 1;
  _curr_loc = (uint *)slots_num_ref;
  slots_num_ref_local = (int *)conflict_locs;
  conflict_locs_local._0_4_ = type;
  conflict_locs_local._4_4_ = start_loc;
  _type_local = gen_ctx;
  for (best_loc = start_loc; (ulong)best_loc <= _type_local->func_stack_slots_num + 0x21;
      best_loc = best_loc + 1) {
    local_3c = target_locs_num(best_loc,(MIR_type_t)conflict_locs_local);
    MVar1 = target_nth_loc(best_loc,(MIR_type_t)conflict_locs_local,local_3c - 1);
    if (_type_local->func_stack_slots_num + 0x21 < (ulong)MVar1) break;
    for (local_38 = 0; local_38 < (int)local_3c; local_38 = local_38 + 1) {
      k = target_nth_loc(best_loc,(MIR_type_t)conflict_locs_local,local_38);
      iVar2 = bitmap_bit_p((const_bitmap_t)slots_num_ref_local,(ulong)(uint)k);
      if (iVar2 != 0) break;
    }
    if ((((int)local_3c <= local_38) && ((best_loc - 0x22) % local_3c == 0)) && (slots_num == -1)) {
      slots_num = best_loc;
    }
  }
  if (slots_num == -1) {
    slots_num = get_new_stack_slot(_type_local,(MIR_type_t)conflict_locs_local,(int *)&local_3c);
  }
  *_curr_loc = local_3c;
  return slots_num;
}

Assistant:

static MIR_reg_t get_stack_loc (gen_ctx_t gen_ctx, MIR_reg_t start_loc, MIR_type_t type,
                                bitmap_t conflict_locs, int *slots_num_ref) {
  MIR_reg_t loc, curr_loc, best_loc = MIR_NON_VAR;
  int k, slots_num = 1;
  for (loc = start_loc; loc <= func_stack_slots_num + MAX_HARD_REG; loc++) {
    slots_num = target_locs_num (loc, type);
    if (target_nth_loc (loc, type, slots_num - 1) > func_stack_slots_num + MAX_HARD_REG) break;
    for (k = 0; k < slots_num; k++) {
      curr_loc = target_nth_loc (loc, type, k);
      if (bitmap_bit_p (conflict_locs, curr_loc)) break;
    }
    if (k < slots_num) continue;
    if ((loc - MAX_HARD_REG - 1) % slots_num != 0)
      continue; /* we align stack slots according to the type size */
    if (best_loc == MIR_NON_VAR) best_loc = loc;
  }
  if (best_loc == MIR_NON_VAR) best_loc = get_new_stack_slot (gen_ctx, type, &slots_num);
  *slots_num_ref = slots_num;
  return best_loc;
}